

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O3

void Rwr_ManPrecompute(Rwr_Man_t *p)

{
  Rwr_Node_t *p0;
  Rwr_Node_t *p1;
  void **ppvVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  int Level;
  long lVar7;
  uint uVar8;
  int Volume;
  uint uVar9;
  ulong local_60;
  uint local_54;
  long local_50;
  
  pVVar5 = p->vForest;
  iVar4 = pVVar5->nSize;
  if (1 < iVar4) {
    local_54 = 0xffffffff;
    local_60 = 1;
    local_50 = 0;
    do {
      if (1 < iVar4) {
        p0 = (Rwr_Node_t *)pVVar5->pArray[local_60];
        lVar7 = 1;
        do {
          p1 = (Rwr_Node_t *)pVVar5->pArray[lVar7];
          uVar8 = (byte)p0->field_0x11 & 0x3f;
          if ((int)local_54 < (int)uVar8) {
            printf("Starting level %d  (at %d nodes).\n",(ulong)(uVar8 + 1),local_60 & 0xffffffff);
            printf("Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n",
                   (ulong)(uint)(p->nConsidered / 1000000),(ulong)(uint)p->vForest->nSize,
                   (ulong)(uint)p->nClasses,local_60 & 0xffffffff);
            local_54 = uVar8;
          }
          if (local_50 + lVar7 == 1) break;
          uVar3 = (byte)p0->field_0x11 & 0x3f;
          uVar8 = (byte)p1->field_0x11 & 0x3f;
          if (5 < uVar8 + uVar3) break;
          if (uVar8 < uVar3) {
            uVar8 = uVar3;
          }
          Level = uVar8 + 1;
          iVar4 = Rwr_ManNodeVolume(p,p0,p1);
          Volume = iVar4 + 1;
          Rwr_ManTryNode(p,p0,p1,0,Level,Volume);
          Rwr_ManTryNode(p,(Rwr_Node_t *)((ulong)p0 ^ 1),p1,0,Level,Volume);
          Rwr_ManTryNode(p,p0,(Rwr_Node_t *)((ulong)p1 ^ 1),0,Level,Volume);
          Rwr_ManTryNode(p,(Rwr_Node_t *)((ulong)p0 ^ 1),(Rwr_Node_t *)((ulong)p1 ^ 1),0,Level,
                         Volume);
          Rwr_ManTryNode(p,p0,p1,1,Level,iVar4 + 2);
          iVar4 = p->nConsidered;
          if ((iVar4 * 0x22e90e21 + 0x1500U >> 7 | iVar4 * 0x42000000) < 0x55) {
            printf("Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n",
                   (ulong)(uint)(iVar4 / 1000000),(ulong)(uint)p->vForest->nSize,
                   (ulong)(uint)p->nClasses,local_60);
          }
          pVVar5 = p->vForest;
          if ((long)pVVar5->nSize == 0x40005) {
            printf("Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n",
                   (ulong)(uint)(p->nConsidered / 1000000),0x40005,(ulong)(uint)p->nClasses,local_60
                  );
            pVVar5 = p->vForest;
            goto LAB_00448188;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < pVVar5->nSize);
        pVVar5 = p->vForest;
        iVar4 = pVVar5->nSize;
      }
      local_60 = local_60 + 1;
      local_50 = local_50 + -1;
    } while ((long)local_60 < (long)iVar4);
  }
LAB_00448188:
  uVar8 = p->nTravIds;
  p->nTravIds = uVar8 + 1;
  uVar3 = pVVar5->nSize;
  if (0x8ffffffe < uVar8) {
    if (0 < (int)uVar3) {
      ppvVar1 = pVVar5->pArray;
      uVar6 = 0;
      do {
        *(undefined4 *)((long)ppvVar1[uVar6] + 4) = 0;
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    p->nTravIds = 1;
  }
  uVar9 = 5;
  uVar8 = 0;
  if (5 < (int)uVar3) {
    uVar8 = 0;
    lVar7 = 5;
    do {
      uVar3 = *(uint *)&((Rwr_Node_t *)pVVar5->pArray[lVar7])->field_0xe;
      if (p->puCanons[uVar3 & 0xffff] == (unsigned_short)uVar3) {
        Rwr_MarkUsed_rec(p,(Rwr_Node_t *)pVVar5->pArray[lVar7]);
        uVar8 = uVar8 + 1;
        pVVar5 = p->vForest;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar5->nSize);
    if (5 < pVVar5->nSize) {
      uVar9 = 5;
      lVar7 = 5;
      do {
        puVar2 = (uint *)pVVar5->pArray[lVar7];
        if ((*(byte *)((long)puVar2 + 0x11) & 0x40) != 0) {
          pVVar5->pArray[(int)uVar9] = puVar2;
          *puVar2 = uVar9;
          uVar9 = uVar9 + 1;
          pVVar5 = p->vForest;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar5->nSize);
    }
  }
  pVVar5->nSize = uVar9;
  printf("Total canonical = %4d. Total used = %5d.\n",(ulong)uVar8,(ulong)uVar9);
  return;
}

Assistant:

void Rwr_ManPrecompute( Rwr_Man_t * p )
{
    Rwr_Node_t * p0, * p1;
    int i, k, Level, Volume;
    int LevelOld = -1;
    int nNodes;

    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p0, i, 1 )
    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p1, k, 1 )
    {
        if ( LevelOld < (int)p0->Level )
        {
            LevelOld = p0->Level;
            printf( "Starting level %d  (at %d nodes).\n", LevelOld+1, i );
            printf( "Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n", 
                p->nConsidered/1000000, p->vForest->nSize, p->nClasses, i );
        }

        if ( k == i )
            break;
//        if ( p0->Level + p1->Level > 6 ) // hard
//            break;

        if ( p0->Level + p1->Level > 5 ) // easy 
            break;

//        if ( p0->Level + p1->Level > 6 || (p0->Level == 3 && p1->Level == 3) )
//            break;

        // compute the level and volume of the new nodes
        Level  = 1 + Abc_MaxInt( p0->Level, p1->Level );
        Volume = 1 + Rwr_ManNodeVolume( p, p0, p1 );
        // try four different AND nodes
        Rwr_ManTryNode( p,         p0 ,         p1 , 0, Level, Volume );
        Rwr_ManTryNode( p, Rwr_Not(p0),         p1 , 0, Level, Volume );
        Rwr_ManTryNode( p,         p0 , Rwr_Not(p1), 0, Level, Volume );
        Rwr_ManTryNode( p, Rwr_Not(p0), Rwr_Not(p1), 0, Level, Volume );
        // try EXOR
        Rwr_ManTryNode( p,         p0 ,         p1 , 1, Level, Volume + 1 );
        // report the progress
        if ( p->nConsidered % 50000000 == 0 )
            printf( "Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n", 
                p->nConsidered/1000000, p->vForest->nSize, p->nClasses, i );
        // quit after some time
        if ( p->vForest->nSize == RWR_LIMIT + 5 )
        {
            printf( "Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n", 
                p->nConsidered/1000000, p->vForest->nSize, p->nClasses, i );
            goto save;
        }
    }
save :

    // mark the relevant ones
    Rwr_ManIncTravId( p );
    k = 5;
    nNodes = 0;
    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p0, i, 5 )
        if ( p0->uTruth == p->puCanons[p0->uTruth] )
        {
            Rwr_MarkUsed_rec( p, p0 );
            nNodes++;
        }

    // compact the array by throwing away non-canonical
    k = 5;
    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p0, i, 5 )
        if ( p0->fUsed )
        {
            p->vForest->pArray[k] = p0;
            p0->Id = k++;
        }
    p->vForest->nSize = k;
    printf( "Total canonical = %4d. Total used = %5d.\n", nNodes, p->vForest->nSize );
}